

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtDbvt.cpp
# Opt level: O1

int __thiscall
cbtDbvt::clone(cbtDbvt *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  cbtDbvtNode *pcVar3;
  cbtDbvtNode *pcVar4;
  cbtDbvtNode *pcVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  int extraout_EAX;
  int extraout_EAX_00;
  sStkCLN *psVar9;
  cbtDbvtNode *pcVar10;
  cbtDbvtNode **ppcVar11;
  long lVar12;
  int iVar13;
  int iVar14;
  cbtAlignedObjectArray<cbtDbvt::sStkCLN> stack;
  cbtAlignedObjectArray<cbtDbvt::sStkCLN> cStack_58;
  long *local_38;
  
  local_38 = (long *)__child_stack;
  clear((cbtDbvt *)__fn);
  iVar13 = extraout_EAX;
  if (this->m_root != (cbtDbvtNode *)0x0) {
    cStack_58.m_ownsMemory = true;
    cStack_58.m_data = (sStkCLN *)0x0;
    cStack_58.m_size = 0;
    cStack_58.m_capacity = 0;
    iVar13 = this->m_leaves;
    psVar9 = cStack_58.m_data;
    iVar14 = cStack_58.m_capacity;
    if (0 < (long)iVar13) {
      psVar9 = (sStkCLN *)cbtAlignedAllocInternal((long)iVar13 << 4,0x10);
      if (0 < (long)cStack_58.m_size) {
        lVar12 = 0;
        do {
          puVar1 = (undefined8 *)((long)&(cStack_58.m_data)->node + lVar12);
          uVar6 = puVar1[1];
          puVar2 = (undefined8 *)((long)&psVar9->node + lVar12);
          *puVar2 = *puVar1;
          puVar2[1] = uVar6;
          lVar12 = lVar12 + 0x10;
        } while ((long)cStack_58.m_size * 0x10 != lVar12);
      }
      iVar14 = iVar13;
      if ((cStack_58.m_data != (sStkCLN *)0x0) && (cStack_58.m_ownsMemory == true)) {
        cbtAlignedFreeInternal(cStack_58.m_data);
      }
    }
    cStack_58.m_capacity = iVar14;
    cStack_58.m_data = psVar9;
    cStack_58.m_ownsMemory = true;
    pcVar3 = this->m_root;
    psVar9 = cStack_58.m_data;
    iVar13 = cStack_58.m_capacity;
    if (cStack_58.m_size == cStack_58.m_capacity) {
      iVar14 = 1;
      if (cStack_58.m_size != 0) {
        iVar14 = cStack_58.m_size * 2;
      }
      if (cStack_58.m_capacity < iVar14) {
        if (iVar14 == 0) {
          psVar9 = (sStkCLN *)0x0;
        }
        else {
          psVar9 = (sStkCLN *)cbtAlignedAllocInternal((long)iVar14 << 4,0x10);
        }
        if (0 < (long)cStack_58.m_size) {
          lVar12 = 0;
          do {
            puVar1 = (undefined8 *)((long)&(cStack_58.m_data)->node + lVar12);
            uVar6 = puVar1[1];
            puVar2 = (undefined8 *)((long)&psVar9->node + lVar12);
            *puVar2 = *puVar1;
            puVar2[1] = uVar6;
            lVar12 = lVar12 + 0x10;
          } while ((long)cStack_58.m_size * 0x10 != lVar12);
        }
        iVar13 = iVar14;
        if ((cStack_58.m_data != (sStkCLN *)0x0) && (cStack_58.m_ownsMemory == true)) {
          cbtAlignedFreeInternal(cStack_58.m_data);
        }
      }
    }
    cStack_58.m_capacity = iVar13;
    cStack_58.m_data = psVar9;
    cStack_58.m_ownsMemory = true;
    lVar12 = (long)cStack_58.m_size;
    cStack_58.m_size = cStack_58.m_size + 1;
    cStack_58.m_data[lVar12].node = pcVar3;
    cStack_58.m_data[lVar12].parent = (cbtDbvtNode *)0x0;
    do {
      lVar12 = (long)cStack_58.m_size + -1;
      pcVar3 = cStack_58.m_data[lVar12].node;
      pcVar4 = cStack_58.m_data[lVar12].parent;
      pcVar5 = (pcVar3->field_2).childs[0];
      pcVar10 = *(cbtDbvtNode **)(__fn + 8);
      if (pcVar10 == (cbtDbvtNode *)0x0) {
        pcVar10 = (cbtDbvtNode *)cbtAlignedAllocInternal(0x38,0x10);
        (pcVar10->volume).mx.m_floats[2] = 0.0;
        (pcVar10->volume).mx.m_floats[3] = 0.0;
        pcVar10->parent = (cbtDbvtNode *)0x0;
        (pcVar10->field_2).childs[0] = (cbtDbvtNode *)0x0;
        (pcVar10->field_2).childs[1] = (cbtDbvtNode *)0x0;
        (pcVar10->volume).mi.m_floats[0] = 0.0;
        (pcVar10->volume).mi.m_floats[1] = 0.0;
        (pcVar10->volume).mi.m_floats[2] = 0.0;
        (pcVar10->volume).mi.m_floats[3] = 0.0;
        (pcVar10->volume).mx.m_floats[0] = 0.0;
        (pcVar10->volume).mx.m_floats[1] = 0.0;
        (pcVar10->volume).mx.m_floats[2] = 0.0;
        (pcVar10->volume).mx.m_floats[3] = 0.0;
      }
      else {
        *(undefined8 *)(__fn + 8) = 0;
      }
      pcVar10->parent = pcVar4;
      (pcVar10->field_2).childs[0] = pcVar5;
      (pcVar10->field_2).childs[1] = (cbtDbvtNode *)0x0;
      uVar6 = *(undefined8 *)((pcVar3->volume).mi.m_floats + 2);
      uVar7 = *(undefined8 *)(pcVar3->volume).mx.m_floats;
      uVar8 = *(undefined8 *)((pcVar3->volume).mx.m_floats + 2);
      *(undefined8 *)(pcVar10->volume).mi.m_floats = *(undefined8 *)(pcVar3->volume).mi.m_floats;
      *(undefined8 *)((pcVar10->volume).mi.m_floats + 2) = uVar6;
      *(undefined8 *)(pcVar10->volume).mx.m_floats = uVar7;
      *(undefined8 *)((pcVar10->volume).mx.m_floats + 2) = uVar8;
      cStack_58.m_size = cStack_58.m_size + -1;
      ppcVar11 = (cbtDbvtNode **)((long)(&pcVar4->volume + 1) + ((ulong)((uint)lVar12 & 1) + 1) * 8)
      ;
      if (pcVar4 == (cbtDbvtNode *)0x0) {
        ppcVar11 = (cbtDbvtNode **)__fn;
      }
      *ppcVar11 = pcVar10;
      if ((pcVar3->field_2).childs[1] == (cbtDbvtNode *)0x0) {
        (**(code **)(*local_38 + 0x10))(local_38,pcVar10);
      }
      else {
        pcVar4 = (pcVar3->field_2).childs[0];
        if (cStack_58.m_size == cStack_58.m_capacity) {
          iVar13 = cStack_58.m_size * 2;
          if (cStack_58.m_size == 0) {
            iVar13 = 1;
          }
          if (cStack_58.m_capacity < iVar13) {
            if (iVar13 == 0) {
              psVar9 = (sStkCLN *)0x0;
            }
            else {
              psVar9 = (sStkCLN *)cbtAlignedAllocInternal((long)iVar13 << 4,0x10);
            }
            if (0 < (long)cStack_58.m_size) {
              lVar12 = 0;
              do {
                puVar1 = (undefined8 *)((long)&(cStack_58.m_data)->node + lVar12);
                uVar6 = puVar1[1];
                puVar2 = (undefined8 *)((long)&psVar9->node + lVar12);
                *puVar2 = *puVar1;
                puVar2[1] = uVar6;
                lVar12 = lVar12 + 0x10;
              } while ((long)cStack_58.m_size * 0x10 != lVar12);
            }
            if ((cStack_58.m_data != (sStkCLN *)0x0) && (cStack_58.m_ownsMemory == true)) {
              cbtAlignedFreeInternal(cStack_58.m_data);
            }
            cStack_58.m_ownsMemory = true;
            cStack_58.m_data = psVar9;
            cStack_58.m_capacity = iVar13;
          }
        }
        lVar12 = (long)cStack_58.m_size;
        cStack_58.m_size = cStack_58.m_size + 1;
        cStack_58.m_data[lVar12].node = pcVar4;
        cStack_58.m_data[lVar12].parent = pcVar10;
        pcVar3 = (pcVar3->field_2).childs[1];
        if (cStack_58.m_size == cStack_58.m_capacity) {
          iVar13 = cStack_58.m_size * 2;
          if (cStack_58.m_size == 0) {
            iVar13 = 1;
          }
          if (cStack_58.m_capacity < iVar13) {
            if (iVar13 == 0) {
              psVar9 = (sStkCLN *)0x0;
            }
            else {
              psVar9 = (sStkCLN *)cbtAlignedAllocInternal((long)iVar13 << 4,0x10);
            }
            if (0 < (long)cStack_58.m_size) {
              lVar12 = 0;
              do {
                puVar1 = (undefined8 *)((long)&(cStack_58.m_data)->node + lVar12);
                uVar6 = puVar1[1];
                puVar2 = (undefined8 *)((long)&psVar9->node + lVar12);
                *puVar2 = *puVar1;
                puVar2[1] = uVar6;
                lVar12 = lVar12 + 0x10;
              } while ((long)cStack_58.m_size * 0x10 != lVar12);
            }
            if ((cStack_58.m_data != (sStkCLN *)0x0) && (cStack_58.m_ownsMemory == true)) {
              cbtAlignedFreeInternal(cStack_58.m_data);
            }
            cStack_58.m_ownsMemory = true;
            cStack_58.m_data = psVar9;
            cStack_58.m_capacity = iVar13;
          }
        }
        lVar12 = (long)cStack_58.m_size;
        cStack_58.m_size = cStack_58.m_size + 1;
        cStack_58.m_data[lVar12].node = pcVar3;
        cStack_58.m_data[lVar12].parent = pcVar10;
      }
    } while (0 < cStack_58.m_size);
    cbtAlignedObjectArray<cbtDbvt::sStkCLN>::~cbtAlignedObjectArray(&cStack_58);
    iVar13 = extraout_EAX_00;
  }
  return iVar13;
}

Assistant:

void cbtDbvt::clone(cbtDbvt& dest, IClone* iclone) const
{
	dest.clear();
	if (m_root != 0)
	{
		cbtAlignedObjectArray<sStkCLN> stack;
		stack.reserve(m_leaves);
		stack.push_back(sStkCLN(m_root, 0));
		do
		{
			const int i = stack.size() - 1;
			const sStkCLN e = stack[i];
			cbtDbvtNode* n = createnode(&dest, e.parent, e.node->volume, e.node->data);
			stack.pop_back();
			if (e.parent != 0)
				e.parent->childs[i & 1] = n;
			else
				dest.m_root = n;
			if (e.node->isinternal())
			{
				stack.push_back(sStkCLN(e.node->childs[0], n));
				stack.push_back(sStkCLN(e.node->childs[1], n));
			}
			else
			{
				iclone->CloneLeaf(n);
			}
		} while (stack.size() > 0);
	}
}